

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O2

void gen_tbl(CPUPPCState_conflict2 *env)

{
  _spr_register(env,0x10c,"TBL",spr_read_tbl,spr_noaccess,spr_read_tbl,spr_noaccess,spr_read_tbl,
                spr_noaccess,0);
  _spr_register(env,0x11c,"TBL",spr_read_tbl,spr_noaccess,spr_read_tbl,spr_write_tbl,spr_read_tbl,
                spr_write_tbl,0);
  _spr_register(env,0x10d,"TBU",spr_read_tbu,spr_noaccess,spr_read_tbu,spr_noaccess,spr_read_tbu,
                spr_noaccess,0);
  _spr_register(env,0x11d,"TBU",spr_read_tbu,spr_noaccess,spr_read_tbu,spr_write_tbu,spr_read_tbu,
                spr_write_tbu,0);
  return;
}

Assistant:

static void gen_tbl(CPUPPCState *env)
{
    spr_register(env, SPR_VTBL,  "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_TBL,   "TBL",
                 &spr_read_tbl, SPR_NOACCESS,
                 &spr_read_tbl, &spr_write_tbl,
                 0x00000000);
    spr_register(env, SPR_VTBU,  "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, SPR_NOACCESS,
                 0x00000000);
    spr_register(env, SPR_TBU,   "TBU",
                 &spr_read_tbu, SPR_NOACCESS,
                 &spr_read_tbu, &spr_write_tbu,
                 0x00000000);
}